

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O0

Var Js::JavascriptSymbol::EntryKeyFor(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  charcount_t cVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  JavascriptLibrary *this;
  Var pvVar7;
  JavascriptSymbol *this_00;
  PropertyRecord *pPVar8;
  char16 *stringKey;
  PropertyRecord *pPVar9;
  JavascriptString *pJVar10;
  RecyclableObject *pRVar11;
  PropertyRecord *propertyRecord;
  charcount_t keyLength;
  char16 *key;
  PropertyRecord *symPropertyRecord;
  JavascriptSymbol *sym;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x93,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x94,"(args.Info.Count)","Should always have implicit \'this\'.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetLibrary(pSVar4);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x98,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar2 = VarIs<Js::JavascriptSymbol>(pvVar7);
    if (bVar2) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
      this_00 = VarTo<Js::JavascriptSymbol>(pvVar7);
      pPVar8 = GetValue(this_00);
      stringKey = PropertyRecord::GetBuffer(pPVar8);
      cVar3 = PropertyRecord::GetLength(pPVar8);
      pTVar5 = ScriptContext::GetThreadContext(pSVar4);
      pPVar8 = ThreadContext::GetSymbolFromRegistrationMap(pTVar5,stringKey,cVar3);
      if ((pPVar8 != (PropertyRecord *)0x0) && (pPVar9 = GetValue(this_00), pPVar8 == pPVar9)) {
        pPVar8 = GetValue(this_00);
        cVar3 = PropertyRecord::GetLength(pPVar8);
        pJVar10 = JavascriptString::NewCopyBuffer(stringKey,cVar3,pSVar4);
        return pJVar10;
      }
      pRVar11 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      return pRVar11;
    }
  }
  JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ea1a,L"Symbol.keyFor");
}

Assistant:

Var JavascriptSymbol::EntryKeyFor(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count, "Should always have implicit 'this'.");
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count < 2 || !VarIs<JavascriptSymbol>(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedSymbol, _u("Symbol.keyFor"));
        }

        JavascriptSymbol* sym = VarTo<JavascriptSymbol>(args[1]);
        const Js::PropertyRecord* symPropertyRecord = sym->GetValue();
        const char16* key = symPropertyRecord->GetBuffer();
        const charcount_t keyLength = symPropertyRecord->GetLength();

        // Search the global symbol registration map for a key equal to the description of the symbol passed into Symbol.keyFor.
        // Symbol.for creates a new symbol with description equal to the key and uses that key as a mapping to the new symbol.
        // There will only be one symbol in the map with that string key value.
        const Js::PropertyRecord* propertyRecord = scriptContext->GetThreadContext()->GetSymbolFromRegistrationMap(key, keyLength);

        // If we found a PropertyRecord in the map, make sure it is the same symbol that was passed to Symbol.keyFor.
        // If the two are different, it means the symbol passed to keyFor has the same description as a symbol registered via
        // Symbol.for _but_ is not the symbol returned from Symbol.for.
        if (propertyRecord != nullptr && propertyRecord == sym->GetValue())
        {
            return JavascriptString::NewCopyBuffer(key, sym->GetValue()->GetLength(), scriptContext);
        }

        return library->GetUndefined();
    }